

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_array.h
# Opt level: O2

void __thiscall v_array<char>::clear(v_array<char> *this)

{
  ulong uVar1;
  
  uVar1 = this->erase_count + 1;
  this->erase_count = uVar1;
  if (0x3ff < uVar1) {
    resize(this,(long)this->_end - (long)this->_begin);
    this->erase_count = 0;
  }
  this->_end = this->_begin;
  return;
}

Assistant:

void clear()
  {
    if (++erase_count & erase_point)
    {
      resize(_end - _begin);
      erase_count = 0;
    }
    for (T* item = _begin; item != _end; ++item) item->~T();
    _end = _begin;
  }